

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O3

void __thiscall Address::Address(Address *this,Address *obj)

{
  (this->country)._M_dataplus._M_p = (pointer)&(this->country).field_2;
  (this->country)._M_string_length = 0;
  (this->country).field_2._M_local_buf[0] = '\0';
  (this->city)._M_dataplus._M_p = (pointer)&(this->city).field_2;
  (this->city)._M_string_length = 0;
  (this->city).field_2._M_local_buf[0] = '\0';
  (this->street)._M_dataplus._M_p = (pointer)&(this->street).field_2;
  (this->street)._M_string_length = 0;
  (this->street).field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->country,&obj->country);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->city,&obj->city);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->street,&obj->street);
  return;
}

Assistant:

Address::Address(const Address &obj) {
    this->country = obj.country;
    this->city = obj.city;
    this->street = obj.street;
}